

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

float __thiscall lunasvg::Font::ascent(Font *this)

{
  bool bVar1;
  plutovg_font_face_t *face;
  float local_14;
  Font *pFStack_10;
  float ascent;
  Font *this_local;
  
  local_14 = 0.0;
  if (0.0 < this->m_size) {
    pFStack_10 = this;
    bVar1 = FontFace::isNull(&this->m_face);
    if (!bVar1) {
      face = FontFace::get(&this->m_face);
      plutovg_font_face_get_metrics
                (face,this->m_size,&local_14,(float *)0x0,(float *)0x0,(plutovg_rect_t *)0x0);
    }
  }
  return local_14;
}

Assistant:

float Font::ascent() const
{
    float ascent = 0;
    if(m_size > 0.f && !m_face.isNull())
        plutovg_font_face_get_metrics(m_face.get(), m_size, &ascent, nullptr, nullptr, nullptr);
    return ascent;
}